

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

char * path_encode(char *path)

{
  uint uVar1;
  size_t sVar2;
  ushort **ppuVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  sVar2 = strlen(path);
  uVar8 = 0;
  if (0 < (int)(uint)sVar2) {
    uVar6 = 0;
    do {
      bVar5 = path[uVar6];
      uVar7 = (uint)uVar8;
      if (((bVar5 - 0x2e < 0x32) && ((0x2000000000003U >> ((ulong)(bVar5 - 0x2e) & 0x3f) & 1) != 0))
         || (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(char)bVar5] & 8) != 0)) {
        if (0xffe < uVar7) break;
        iVar4 = 1;
        uVar1 = uVar7;
      }
      else {
        if (0xffc < uVar7) break;
        path_encode::temp[uVar8] = '-';
        uVar1 = uVar7 + 2;
        path_encode::temp[uVar8 + 1] = "0123456789ABCDEF"[bVar5 >> 4];
        bVar5 = "0123456789ABCDEF"[bVar5 & 0xf];
        iVar4 = 3;
      }
      uVar7 = uVar7 + iVar4;
      uVar8 = (ulong)uVar7;
      path_encode::temp[uVar1] = bVar5;
      uVar6 = uVar6 + 1;
    } while (((uint)sVar2 & 0x7fffffff) != uVar6);
    uVar8 = (ulong)(int)uVar7;
  }
  path_encode::temp[uVar8] = '\0';
  return path_encode::temp;
}

Assistant:

static const char *path_encode(const char *path)
{
	static char temp[FILENAME_MAX];
	int i, pos = 0;
	int path_len = (int)strlen(path);
	for (i = 0; i < path_len; ++i) {
		int ch = path[i];
		if (valid_path_char(ch)) {
			if (pos >= sizeof(temp) - 1)
				break;

			temp[pos++] = (char)ch;
		} else {
			if (pos >= sizeof(temp) - 3)
				break;

			temp[pos++] = '-';
			temp[pos++] = "0123456789ABCDEF"[(ch >> 4) & 0xF];
			temp[pos++] = "0123456789ABCDEF"[ch & 0xF];
		}
	}

	temp[pos] = '\0';
	return temp;
}